

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BarrierTests.cpp
# Opt level: O2

void __thiscall barrier_basic_Test::~barrier_basic_Test(barrier_basic_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(barrier, basic)
{
    Barrier barrier1(2);
    std::atomic<int> count{0};
    auto fut1 = std::async(std::launch::async, [&barrier1, &count]() {
        barrier1.wait();
        ++count;
    });
    std::this_thread::sleep_for(std::chrono::milliseconds(50));
    EXPECT_EQ(count.load(), 0);
    auto fut2 = std::async(std::launch::async, [&barrier1, &count]() {
        barrier1.wait();
        ++count;
    });
    std::this_thread::sleep_for(std::chrono::milliseconds(50));
    EXPECT_EQ(count.load(), 2);
    fut2.get();
    fut1.get();
}